

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countryflags.cpp
# Opt level: O1

CCountryFlag * __thiscall CCountryFlags::GetByIndex(CCountryFlags *this,int Index,bool SkipBlocked)

{
  CCountryFlag *pCVar1;
  CCountryFlag *in_RAX;
  uint uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  if ((int)CONCAT71(in_register_00000011,SkipBlocked) != 0) {
    uVar3 = (ulong)(this->m_aCountryFlags).
                   super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                   .num_elements;
    bVar6 = 0 < (long)uVar3;
    if (0 < (long)uVar3) {
      uVar4 = 1;
      pCVar1 = (this->m_aCountryFlags).
               super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
               .list;
      do {
        in_RAX = pCVar1;
        if ((in_RAX->m_Blocked == false) && (bVar5 = Index == 0, Index = Index + -1, bVar5)) break;
        bVar6 = uVar4 < uVar3;
        bVar5 = uVar4 != uVar3;
        uVar4 = uVar4 + 1;
        pCVar1 = in_RAX + 1;
      } while (bVar5);
    }
    if (bVar6) {
      return in_RAX;
    }
  }
  uVar2 = Index % (this->m_aCountryFlags).
                  super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>
                  .num_elements;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)uVar2;
  }
  return (this->m_aCountryFlags).
         super_array<CCountryFlags::CCountryFlag,_allocator_default<CCountryFlags::CCountryFlag>_>.
         list + uVar3;
}

Assistant:

const CCountryFlags::CCountryFlag *CCountryFlags::GetByIndex(int Index, bool SkipBlocked) const
{
	if(SkipBlocked)
	{
		for(int i = 0; i < m_aCountryFlags.size(); i++)
			if(!m_aCountryFlags[i].m_Blocked)
				if(!Index--)
					return &m_aCountryFlags[i];
	}
	return &m_aCountryFlags[maximum(0, Index%m_aCountryFlags.size())];
}